

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_anomaly_test.cc
# Opt level: O3

void read_failure_test(void)

{
  undefined8 *puVar1;
  size_t sVar2;
  void *pvVar3;
  long lVar4;
  ulong uVar5;
  undefined1 auVar6 [8];
  fdb_status fVar7;
  int iVar8;
  fdb_kvs_handle *pfVar9;
  undefined1 auVar10 [8];
  size_t sVar11;
  undefined8 uVar12;
  undefined4 extraout_EDX;
  ulong uVar13;
  char *pcVar14;
  fdb_doc *pfVar15;
  fdb_kvs_handle *pfVar16;
  fdb_kvs_handle *pfVar17;
  fdb_config *in_R8;
  char *in_R9;
  fdb_kvs_handle *unaff_R12;
  long lVar18;
  undefined1 auVar19 [8];
  void *__s1;
  undefined8 auStack_e90 [5];
  size_t asStack_e68 [2];
  fdb_doc fStack_e58;
  timeval tStack_e08;
  size_t asStack_df8 [2];
  fdb_doc *local_de8 [300];
  char local_488 [8];
  char temp [256];
  char metabuf [256];
  char bodybuf [256];
  fdb_config fconfig;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  undefined1 local_58 [8];
  fdb_doc *rdoc;
  fdb_file_handle *dbfile;
  fail_ctx_t fail_ctx;
  fdb_kvs_handle *db;
  
  __s1 = (void *)0x0;
  asStack_df8[1] = 0x1071af;
  gettimeofday((timeval *)&fconfig.num_blocks_readahead,(__timezone_ptr_t)0x0);
  asStack_df8[1] = 0x1071b4;
  memleak_start();
  asStack_df8[1] = 0x1071b9;
  pfVar9 = (fdb_kvs_handle *)get_default_anon_cbs();
  fail_ctx.num_fails = 0;
  dbfile = (fdb_file_handle *)0x0;
  (pfVar9->kvs_config).custom_cmp_param = pread_failure_cb;
  asStack_df8[1] = 0x1071de;
  system("rm -rf  anomaly_test* > errorlog.txt");
  asStack_df8[1] = 0x1071e9;
  filemgr_ops_anomalous_init((anomalous_callbacks *)pfVar9,&dbfile);
  fail_ctx.num_fails = 1000;
  auVar10 = (undefined1  [8])(bodybuf + 0xf8);
  asStack_df8[1] = 0x107200;
  fdb_get_default_config();
  asStack_df8[1] = 0x107209;
  fdb_get_default_kvs_config();
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0;
  fconfig.blocksize = 0;
  fconfig.purging_interval = 1;
  fconfig.wal_threshold._4_4_ = 0;
  fconfig.flags._3_1_ = 0;
  lVar4 = -((long)(bodybuf._252_4_ + -0x100) + 0xfU & 0xfffffffffffffff0);
  pcVar14 = (char *)((long)local_de8 + lVar4);
  pfVar16 = (fdb_kvs_handle *)&rdoc;
  *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x107251;
  fVar7 = fdb_open((fdb_file_handle **)pfVar16,"./anomaly_test1",(fdb_config *)auVar10);
  pfVar17 = (fdb_kvs_handle *)rdoc;
  if (fVar7 == FDB_RESULT_SUCCESS) {
    *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x10726a;
    fVar7 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfVar17,(fdb_kvs_handle **)&fail_ctx.start_failing_after,
                       (fdb_kvs_config *)&__test_begin.tv_usec);
    pfVar16 = stack0xffffffffffffffc8;
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001075d3;
    *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x107289;
    fVar7 = fdb_set_log_callback(pfVar16,logCallbackFunc,"read_failure_test");
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001075d8;
    pfVar9 = (fdb_kvs_handle *)0x0;
    __s1 = (void *)0x0;
    do {
      *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x1072ae;
      sprintf(pcVar14,"key%d",(ulong)__s1 & 0xffffffff);
      *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x1072c9;
      sprintf(temp + 0xf8,"meta%d",(ulong)__s1 & 0xffffffff);
      *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x1072e1;
      sprintf(metabuf + 0xf8,"body%d",(ulong)__s1 & 0xffffffff);
      *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x1072f7;
      unaff_R12 = (fdb_kvs_handle *)strlen(pcVar14);
      *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x107302;
      auVar10 = (undefined1  [8])strlen(temp + 0xf8);
      *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x107311;
      sVar11 = strlen(metabuf + 0xf8);
      in_R9 = metabuf + 0xf8;
      *(size_t *)((long)asStack_df8 + lVar4) = sVar11;
      *(undefined8 *)((long)asStack_df8 + lVar4 + -8) = 0x107336;
      in_R8 = (fdb_config *)auVar10;
      fdb_doc_create((fdb_doc **)((long)local_de8 + (long)pfVar9),pcVar14,(size_t)unaff_R12,
                     temp + 0xf8,(size_t)auVar10,in_R9,*(size_t *)((long)asStack_df8 + lVar4));
      pfVar16 = stack0xffffffffffffffc8;
      pfVar15 = local_de8[(long)__s1];
      *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x10734b;
      fVar7 = fdb_set(pfVar16,pfVar15);
      pfVar16 = (fdb_kvs_handle *)rdoc;
      auVar19 = auVar10;
      if (fVar7 != FDB_RESULT_SUCCESS) {
        *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x1075b3;
        read_failure_test();
        goto LAB_001075b3;
      }
      __s1 = (void *)((long)__s1 + 1);
      pfVar9 = (fdb_kvs_handle *)&(pfVar9->kvs_config).custom_cmp;
    } while (__s1 != (void *)0x12c);
    *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x107372;
    fVar7 = fdb_commit((fdb_file_handle *)pfVar16,'\0');
    pfVar17 = stack0xffffffffffffffc8;
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001075dd;
    *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x107383;
    fdb_kvs_close(pfVar17);
    pfVar15 = rdoc;
    pfVar9 = (fdb_kvs_handle *)&rdoc;
    *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x10738f;
    fdb_close((fdb_file_handle *)pfVar15);
    fail_ctx.num_fails = dbfile._4_4_;
    *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x1073ab;
    pfVar16 = pfVar9;
    fVar7 = fdb_open((fdb_file_handle **)pfVar9,"./anomaly_test1",(fdb_config *)(bodybuf + 0xf8));
    if ((fVar7 == FDB_RESULT_SB_READ_FAIL) || (fVar7 == FDB_RESULT_READ_FAIL)) {
      fail_ctx.num_fails = dbfile._4_4_ + 1000;
      pfVar16 = (fdb_kvs_handle *)&rdoc;
      *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x1073db;
      fVar7 = fdb_open((fdb_file_handle **)pfVar16,"./anomaly_test1",(fdb_config *)(bodybuf + 0xf8))
      ;
      pfVar17 = (fdb_kvs_handle *)rdoc;
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001075e2;
      *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x1073f4;
      fVar7 = fdb_kvs_open_default
                        ((fdb_file_handle *)pfVar17,(fdb_kvs_handle **)&fail_ctx.start_failing_after
                         ,(fdb_kvs_config *)&__test_begin.tv_usec);
      pfVar16 = stack0xffffffffffffffc8;
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001075e7;
      *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x107413;
      fVar7 = fdb_set_log_callback(pfVar16,logCallbackFunc,"read_failure_test");
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001075ec;
      fail_ctx.num_fails = dbfile._4_4_;
      sVar2 = local_de8[0]->keylen;
      pvVar3 = local_de8[0]->key;
      pfVar9 = (fdb_kvs_handle *)local_58;
      in_R8 = (fdb_config *)0x0;
      in_R9 = (char *)0x0;
      *(undefined8 *)((long)asStack_df8 + lVar4) = 0;
      *(undefined8 *)((long)asStack_df8 + lVar4 + -8) = 0x107449;
      fdb_doc_create((fdb_doc **)pfVar9,pvVar3,sVar2,(void *)0x0,0,(void *)0x0,
                     *(size_t *)((long)asStack_df8 + lVar4));
      pfVar16 = stack0xffffffffffffffc8;
      auVar6 = local_58;
      *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x107459;
      fVar7 = fdb_get(pfVar16,(fdb_doc *)auVar6);
      auVar6 = local_58;
      if (fVar7 == FDB_RESULT_READ_FAIL) {
        *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x10746e;
        fdb_doc_free((fdb_doc *)auVar6);
        fail_ctx.num_fails = dbfile._4_4_ + 1000;
        lVar18 = 0;
        while( true ) {
          sVar2 = local_de8[lVar18]->keylen;
          pvVar3 = local_de8[lVar18]->key;
          in_R8 = (fdb_config *)0x0;
          in_R9 = (char *)0x0;
          *(undefined8 *)((long)asStack_df8 + lVar4) = 0;
          *(undefined8 *)((long)asStack_df8 + lVar4 + -8) = 0x1074a2;
          fdb_doc_create((fdb_doc **)local_58,pvVar3,sVar2,(void *)0x0,0,(void *)0x0,
                         *(size_t *)((long)asStack_df8 + lVar4));
          pfVar16 = stack0xffffffffffffffc8;
          auVar10 = local_58;
          *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x1074b3;
          fVar7 = fdb_get(pfVar16,(fdb_doc *)auVar10);
          auVar10 = local_58;
          if (fVar7 != FDB_RESULT_SUCCESS) break;
          sVar11 = *(uint64_t *)((long)local_58 + 8);
          __s1 = *(void **)((long)local_58 + 0x38);
          pfVar9 = (fdb_kvs_handle *)local_de8[lVar18];
          unaff_R12 = (fdb_kvs_handle *)pfVar9->staletree;
          *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x1074de;
          iVar8 = bcmp(__s1,unaff_R12,sVar11);
          if (iVar8 != 0) goto LAB_001075b8;
          sVar11 = *(uint64_t *)((long)auVar10 + 0x10);
          __s1 = *(void **)((long)auVar10 + 0x40);
          unaff_R12 = (fdb_kvs_handle *)(pfVar9->field_6).seqtree;
          *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x1074fd;
          iVar8 = bcmp(__s1,unaff_R12,sVar11);
          if (iVar8 != 0) goto LAB_001075c3;
          *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x10750d;
          fdb_doc_free((fdb_doc *)auVar10);
          lVar18 = lVar18 + 1;
          auVar19 = auVar10;
          if (lVar18 == 300) {
            *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x107526;
            fdb_kvs_close(stack0xffffffffffffffc8);
            *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x10752f;
            fdb_close((fdb_file_handle *)rdoc);
            lVar18 = 0;
            do {
              pfVar15 = local_de8[lVar18];
              *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x10753e;
              fdb_doc_free(pfVar15);
              lVar18 = lVar18 + 1;
            } while (lVar18 != 300);
            *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x10754f;
            fdb_shutdown();
            *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x107554;
            memleak_end();
            uVar13 = (ulong)dbfile & 0xffffffff;
            uVar5 = (ulong)dbfile >> 0x20;
            *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x107572;
            sprintf(local_488,"read failure test: %d failures out of %d reads",uVar13,uVar5);
            pcVar14 = "%s PASSED\n";
            if (read_failure_test()::__test_pass != '\0') {
              pcVar14 = "%s FAILED\n";
            }
            *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x10759f;
            fprintf(_stderr,pcVar14,local_488);
            return;
          }
        }
LAB_001075b3:
        auVar10 = auVar19;
        *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x1075b8;
        read_failure_test();
LAB_001075b8:
        *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x1075c3;
        read_failure_test();
LAB_001075c3:
        *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x1075ce;
        pfVar16 = unaff_R12;
        read_failure_test();
        goto LAB_001075ce;
      }
      goto LAB_001075f1;
    }
  }
  else {
LAB_001075ce:
    *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x1075d3;
    read_failure_test();
    pfVar17 = pfVar16;
LAB_001075d3:
    pfVar16 = pfVar17;
    *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x1075d8;
    read_failure_test();
LAB_001075d8:
    *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x1075dd;
    read_failure_test();
LAB_001075dd:
    *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x1075e2;
    read_failure_test();
LAB_001075e2:
    *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x1075e7;
    read_failure_test();
    pfVar17 = pfVar16;
LAB_001075e7:
    pfVar16 = pfVar17;
    *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x1075ec;
    read_failure_test();
LAB_001075ec:
    *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x1075f1;
    read_failure_test();
LAB_001075f1:
    *(undefined8 *)((long)local_de8 + lVar4 + -8) = 0x1075f6;
    read_failure_test();
  }
  *(code **)((long)local_de8 + lVar4 + -8) = bad_thread;
  read_failure_test();
  *(undefined1 (*) [8])((long)local_de8 + lVar4 + -8) = auVar10;
  *(fdb_kvs_handle **)((long)asStack_df8 + lVar4) = pfVar9;
  pfVar9 = (fdb_kvs_handle *)(pfVar16->kvs_config).custom_cmp;
  pfVar16 = (fdb_kvs_handle *)(pfVar16->kvs_config).custom_cmp_param;
  pfVar15 = (fdb_doc *)0x0;
  *(undefined8 *)((long)asStack_e68 + lVar4) = 0x107616;
  gettimeofday((timeval *)((long)&tStack_e08 + lVar4),(__timezone_ptr_t)0x0);
  puVar1 = (undefined8 *)((long)&fStack_e58 + lVar4);
  *(undefined8 *)((long)&fStack_e58 + lVar4 + 0x18) = 0;
  *(undefined8 *)((long)&fStack_e58 + lVar4 + 0x20) = 0;
  *(undefined8 *)((long)&fStack_e58 + lVar4 + 0x38) = 0;
  *(undefined8 *)((long)&fStack_e58 + lVar4 + 0x40) = 0;
  *(undefined8 *)((long)&fStack_e58 + lVar4 + 8) = 0;
  *(undefined8 *)((long)&fStack_e58 + lVar4 + 0x10) = 0;
  *(undefined8 *)((long)&fStack_e58 + lVar4 + 0x28) = 0;
  *(undefined8 *)((long)&fStack_e58 + lVar4 + 0x30) = 0;
  *(undefined8 *)((long)&fStack_e58 + lVar4 + 0x48) = 0;
  *(undefined8 **)((long)&fStack_e58 + lVar4 + 0x20) = puVar1;
  uVar12 = 2;
  *puVar1 = 2;
  *(undefined8 **)((long)&fStack_e58 + lVar4 + 0x40) = puVar1;
  *(undefined8 *)((long)&fStack_e58 + lVar4 + 0x10) = 2;
  if (pfVar16 == (fdb_kvs_handle *)0x0) {
LAB_001076b5:
    pfVar15 = (fdb_doc *)((long)&fStack_e58 + lVar4);
    *(undefined8 *)((long)asStack_e68 + lVar4) = 0x1076c2;
    pfVar17 = pfVar9;
    fVar7 = fdb_set(pfVar9,pfVar15);
    if (fVar7 != FDB_RESULT_HANDLE_BUSY) goto LAB_00107761;
    pfVar15 = (fdb_doc *)((long)&fStack_e58 + lVar4);
    *(undefined8 *)((long)asStack_e68 + lVar4) = 0x1076d8;
    pfVar17 = pfVar9;
    fVar7 = fdb_del(pfVar9,pfVar15);
    if (fVar7 != FDB_RESULT_HANDLE_BUSY) goto LAB_00107766;
    pfVar15 = (fdb_doc *)((long)&fStack_e58 + lVar4);
    *(undefined8 *)((long)asStack_e68 + lVar4) = 0x1076ee;
    pfVar17 = pfVar9;
    fVar7 = fdb_get(pfVar9,pfVar15);
    if (fVar7 != FDB_RESULT_HANDLE_BUSY) goto LAB_0010776b;
    pfVar15 = (fdb_doc *)((long)&fStack_e58 + lVar4);
    *(undefined8 *)((long)asStack_e68 + lVar4) = 0x107700;
    pfVar17 = pfVar9;
    fVar7 = fdb_get_metaonly(pfVar9,pfVar15);
    if (fVar7 != FDB_RESULT_HANDLE_BUSY) goto LAB_00107770;
    pfVar15 = (fdb_doc *)((long)&fStack_e58 + lVar4);
    *(undefined8 *)((long)asStack_e68 + lVar4) = 0x107712;
    pfVar17 = pfVar9;
    fVar7 = fdb_get_byseq(pfVar9,pfVar15);
    if (fVar7 != FDB_RESULT_HANDLE_BUSY) goto LAB_00107775;
    pfVar15 = (fdb_doc *)((long)&fStack_e58 + lVar4);
    *(undefined8 *)((long)asStack_e68 + lVar4) = 0x107724;
    pfVar17 = pfVar9;
    fVar7 = fdb_get_metaonly_byseq(pfVar9,pfVar15);
    if (fVar7 == FDB_RESULT_HANDLE_BUSY) {
      pfVar15 = (fdb_doc *)((long)&fStack_e58 + lVar4);
      *(undefined8 *)((long)&fStack_e58 + lVar4 + 0x30) = 5000;
      *(undefined8 *)((long)asStack_e68 + lVar4) = 0x10773e;
      pfVar17 = pfVar9;
      fVar7 = fdb_get_byoffset(pfVar9,pfVar15);
      if (fVar7 == FDB_RESULT_HANDLE_BUSY) {
        return;
      }
      goto LAB_0010777f;
    }
  }
  else {
    *(undefined8 *)((long)asStack_e68 + lVar4) = 0x107657;
    pfVar17 = pfVar16;
    fVar7 = fdb_iterator_next((fdb_iterator *)pfVar16);
    if (fVar7 == FDB_RESULT_HANDLE_BUSY) {
      *(undefined8 *)((long)asStack_e68 + lVar4) = 0x107668;
      pfVar17 = pfVar16;
      fVar7 = fdb_iterator_prev((fdb_iterator *)pfVar16);
      if (fVar7 != FDB_RESULT_HANDLE_BUSY) goto LAB_00107752;
      *(undefined8 *)((long)asStack_e68 + lVar4) = 0x107679;
      pfVar17 = pfVar16;
      fVar7 = fdb_iterator_seek_to_min((fdb_iterator *)pfVar16);
      if (fVar7 != FDB_RESULT_HANDLE_BUSY) goto LAB_00107757;
      *(undefined8 *)((long)asStack_e68 + lVar4) = 0x10768a;
      pfVar17 = pfVar16;
      fVar7 = fdb_iterator_seek_to_max((fdb_iterator *)pfVar16);
      if (fVar7 == FDB_RESULT_HANDLE_BUSY) {
        pvVar3 = *(void **)((long)&fStack_e58 + lVar4 + 0x20);
        uVar12 = 0;
        *(undefined8 *)((long)asStack_e68 + lVar4) = 0x1076a7;
        fVar7 = fdb_iterator_seek((fdb_iterator *)pfVar16,pvVar3,
                                  *(size_t *)((long)&fStack_e58 + lVar4),'\0');
        if (fVar7 == FDB_RESULT_HANDLE_BUSY) {
          return;
        }
        *(undefined8 *)((long)asStack_e68 + lVar4) = 0x1076b5;
        bad_thread();
        goto LAB_001076b5;
      }
    }
    else {
      *(undefined8 *)((long)asStack_e68 + lVar4) = 0x107752;
      bad_thread();
LAB_00107752:
      *(undefined8 *)((long)asStack_e68 + lVar4) = 0x107757;
      bad_thread();
LAB_00107757:
      *(undefined8 *)((long)asStack_e68 + lVar4) = 0x10775c;
      bad_thread();
    }
    *(undefined8 *)((long)asStack_e68 + lVar4) = 0x107761;
    bad_thread();
LAB_00107761:
    *(undefined8 *)((long)asStack_e68 + lVar4) = 0x107766;
    bad_thread();
LAB_00107766:
    *(undefined8 *)((long)asStack_e68 + lVar4) = 0x10776b;
    bad_thread();
LAB_0010776b:
    *(undefined8 *)((long)asStack_e68 + lVar4) = 0x107770;
    bad_thread();
LAB_00107770:
    *(undefined8 *)((long)asStack_e68 + lVar4) = 0x107775;
    bad_thread();
LAB_00107775:
    *(undefined8 *)((long)asStack_e68 + lVar4) = 0x10777a;
    bad_thread();
  }
  *(undefined8 *)((long)asStack_e68 + lVar4) = 0x10777f;
  bad_thread();
LAB_0010777f:
  *(code **)((long)asStack_e68 + lVar4) = pwrite_hang_cb;
  bad_thread();
  *(undefined1 **)((long)asStack_e68 + lVar4) = &stack0xfffffffffffffff8;
  *(void **)((long)auStack_e90 + lVar4 + 0x20) = __s1;
  *(fdb_kvs_handle **)((long)auStack_e90 + lVar4 + 0x18) = pfVar16;
  *(fdb_kvs_handle **)((long)auStack_e90 + lVar4 + 0x10) = unaff_R12;
  *(fdb_kvs_handle **)((long)auStack_e90 + lVar4 + 8) = pfVar9;
  if (*(char *)&pfVar17->kvs == '\x01') {
    *(undefined8 *)((long)auStack_e90 + lVar4) = 0x1077a5;
    bad_thread(pfVar17);
  }
  (*(code *)pfVar15->metalen)(extraout_EDX,uVar12,in_R8,in_R9);
  return;
}

Assistant:

void read_failure_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n=300;
    int keylen_limit;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc;
    fdb_status status;

    char *keybuf;
    char metabuf[256], bodybuf[256], temp[256];
    // Get the default callbacks which result in normal operation for other ops
    struct anomalous_callbacks *read_fail_cb = get_default_anon_cbs();
    fail_ctx_t fail_ctx;
    memset(&fail_ctx, 0, sizeof(fail_ctx_t));

    // Modify the pread callback to redirect to test-specific function
    read_fail_cb->pread_cb = &pread_failure_cb;

    // remove previous anomaly_test files
    r = system(SHELL_DEL" anomaly_test* > errorlog.txt");
    (void)r;

    // Reset anomalous behavior stats..
    filemgr_ops_anomalous_init(read_fail_cb, &fail_ctx);

    fail_ctx.start_failing_after = 1000; // some large value

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 0;
    fconfig.compaction_threshold = 0;

    keylen_limit = fconfig.blocksize - 256;
    keybuf = alca(char, keylen_limit);

    // open db
    status = fdb_open(&dbfile, "./anomaly_test1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "read_failure_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        status = fdb_set(db, doc[i]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // commit
    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_kvs_close(db);
    fdb_close(dbfile);

    fail_ctx.start_failing_after = fail_ctx.num_ops; // immediately fail

    status = fdb_open(&dbfile, "./anomaly_test1", &fconfig);
    TEST_CHK(status == FDB_RESULT_READ_FAIL || status == FDB_RESULT_SB_READ_FAIL);

    fail_ctx.start_failing_after = fail_ctx.num_ops+1000; //normal operation

    status = fdb_open(&dbfile, "./anomaly_test1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "read_failure_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fail_ctx.start_failing_after = fail_ctx.num_ops; // immediately fail
    i = 0;
    fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
    status = fdb_get(db, rdoc);

    TEST_CHK(status == FDB_RESULT_READ_FAIL);
    // free result document
    fdb_doc_free(rdoc);

    fail_ctx.start_failing_after = fail_ctx.num_ops+1000; //normal operation
    // retrieve documents
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        // free result document
        fdb_doc_free(rdoc);
    }

    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    sprintf(temp, "read failure test: %d failures out of %d reads",
            fail_ctx.num_fails, fail_ctx.num_ops);

    TEST_RESULT(temp);
}